

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O1

void __thiscall chrono::ChLinkDistance::ArchiveOUT(ChLinkDistance *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkDistance>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_38._value = (ChVector<double> *)&this->distance;
  local_38._name = "distance";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = &this->pos1;
  local_38._name = "pos1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->pos2;
  local_38._name = "pos2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkDistance::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkDistance>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(distance);
    marchive << CHNVP(pos1);
    marchive << CHNVP(pos2);
}